

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O0

int lj_cf_misc_getmetrics(lua_State *L)

{
  lua_State *plVar1;
  TValue *pTVar2;
  lua_State *in_RDI;
  lua_State *L_00;
  double dVar3;
  GCtab *m;
  luam_Metrics metrics;
  char *key;
  undefined8 in_stack_fffffffffffffa10;
  lua_State *t;
  lua_State *in_stack_fffffffffffffa18;
  lua_State *L_01;
  size_t in_stack_fffffffffffffa60;
  lua_State *lenx;
  char *in_stack_fffffffffffffa68;
  lua_State *str;
  lua_State *in_stack_fffffffffffffa70;
  luam_Metrics local_300;
  lua_State *local_268;
  ulong local_260;
  char *local_258;
  lua_State *local_250;
  lua_State *local_248;
  size_t local_240;
  char *local_238;
  lua_State *local_230;
  lua_State *local_228;
  size_t local_220;
  char *local_218;
  lua_State *local_210;
  lua_State *local_208;
  size_t local_200;
  char *local_1f8;
  lua_State *local_1f0;
  lua_State *local_1e8;
  size_t local_1e0;
  char *local_1d8;
  lua_State *local_1d0;
  lua_State *local_1c8;
  size_t local_1c0;
  char *local_1b8;
  lua_State *local_1b0;
  lua_State *local_1a8;
  size_t local_1a0;
  char *local_198;
  lua_State *local_190;
  lua_State *local_188;
  size_t local_180;
  char *local_178;
  lua_State *local_170;
  lua_State *local_168;
  size_t local_160;
  char *local_158;
  lua_State *local_150;
  lua_State *local_148;
  size_t local_140;
  char *local_138;
  lua_State *local_130;
  lua_State *local_128;
  size_t local_120;
  char *local_118;
  lua_State *local_110;
  lua_State *local_108;
  size_t local_100;
  char *local_f8;
  lua_State *local_f0;
  lua_State *local_e8;
  size_t local_e0;
  char *local_d8;
  lua_State *local_d0;
  lua_State *local_c8;
  size_t local_c0;
  char *local_b8;
  lua_State *local_b0;
  lua_State *local_a8;
  size_t local_a0;
  char *local_98;
  lua_State *local_90;
  lua_State *local_88;
  size_t local_80;
  char *local_78;
  lua_State *local_70;
  lua_State *local_68;
  size_t local_60;
  char *local_58;
  lua_State *local_50;
  lua_State *local_48;
  size_t local_40;
  char *local_38;
  lua_State *local_30;
  lua_State *local_28;
  size_t local_20;
  char *local_18;
  lua_State *local_10;
  lua_State *local_8;
  
  local_268 = in_RDI;
  lua_createtable(in_stack_fffffffffffffa18,(int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                  (int)in_stack_fffffffffffffa10);
  plVar1 = (lua_State *)(ulong)local_268->top[-1].u32.lo;
  luaM_metrics(local_268,&local_300);
  local_8 = local_268;
  local_18 = "strhash_hit";
  local_20 = local_300.strhash_hit;
  key = "strhash_hit";
  t = local_268;
  L_01 = plVar1;
  local_10 = plVar1;
  strlen("strhash_hit");
  lj_str_new(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.strhash_hit;
  local_28 = local_268;
  local_38 = "strhash_miss";
  local_40 = local_300.strhash_miss;
  local_30 = plVar1;
  strlen("strhash_miss");
  lj_str_new(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.strhash_miss;
  local_48 = local_268;
  local_58 = "gc_strnum";
  local_60 = local_300.gc_strnum;
  L_00 = (lua_State *)(double)(long)local_300.gc_strnum;
  lenx = local_268;
  str = plVar1;
  local_50 = plVar1;
  strlen("gc_strnum");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (lua_Number)L_00;
  local_68 = local_268;
  local_78 = "gc_tabnum";
  local_80 = local_300.gc_tabnum;
  local_70 = plVar1;
  strlen("gc_tabnum");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_tabnum;
  local_88 = local_268;
  local_98 = "gc_udatanum";
  local_a0 = local_300.gc_udatanum;
  local_90 = plVar1;
  strlen("gc_udatanum");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_udatanum;
  local_a8 = local_268;
  local_b8 = "gc_cdatanum";
  local_c0 = local_300.gc_cdatanum;
  local_b0 = plVar1;
  strlen("gc_cdatanum");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_cdatanum;
  local_c8 = local_268;
  local_d8 = "gc_total";
  local_e0 = local_300.gc_total;
  local_d0 = plVar1;
  strlen("gc_total");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_total;
  local_e8 = local_268;
  local_f8 = "gc_freed";
  local_100 = local_300.gc_freed;
  local_f0 = plVar1;
  strlen("gc_freed");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_freed;
  local_108 = local_268;
  local_118 = "gc_allocated";
  local_120 = local_300.gc_allocated;
  local_110 = plVar1;
  strlen("gc_allocated");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_allocated;
  local_128 = local_268;
  local_138 = "gc_steps_pause";
  local_140 = local_300.gc_steps_pause;
  local_130 = plVar1;
  strlen("gc_steps_pause");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_steps_pause;
  local_148 = local_268;
  local_158 = "gc_steps_propagate";
  local_160 = local_300.gc_steps_propagate;
  local_150 = plVar1;
  strlen("gc_steps_propagate");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_steps_propagate;
  local_168 = local_268;
  local_178 = "gc_steps_atomic";
  local_180 = local_300.gc_steps_atomic;
  local_170 = plVar1;
  strlen("gc_steps_atomic");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_steps_atomic;
  local_188 = local_268;
  local_198 = "gc_steps_sweepstring";
  local_1a0 = local_300.gc_steps_sweepstring;
  local_190 = plVar1;
  strlen("gc_steps_sweepstring");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_steps_sweepstring;
  local_1a8 = local_268;
  local_1b8 = "gc_steps_sweep";
  local_1c0 = local_300.gc_steps_sweep;
  local_1b0 = plVar1;
  strlen("gc_steps_sweep");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_steps_sweep;
  local_1c8 = local_268;
  local_1d8 = "gc_steps_finalize";
  local_1e0 = local_300.gc_steps_finalize;
  local_1d0 = plVar1;
  strlen("gc_steps_finalize");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.gc_steps_finalize;
  local_1e8 = local_268;
  local_1f8 = "jit_snap_restore";
  local_200 = local_300.jit_snap_restore;
  local_1f0 = plVar1;
  strlen("jit_snap_restore");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.jit_snap_restore;
  local_208 = local_268;
  local_218 = "jit_trace_abort";
  local_220 = local_300.jit_trace_abort;
  local_210 = plVar1;
  strlen("jit_trace_abort");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.jit_trace_abort;
  local_228 = local_268;
  local_238 = "jit_mcode_size";
  local_240 = local_300.jit_mcode_size;
  local_230 = plVar1;
  strlen("jit_mcode_size");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = (double)(long)local_300.jit_mcode_size;
  local_260 = (ulong)local_300.jit_trace_num;
  local_248 = local_268;
  local_258 = "jit_trace_num";
  dVar3 = (double)local_260;
  local_250 = plVar1;
  strlen("jit_trace_num");
  lj_str_new(L_00,(char *)str,(size_t)lenx);
  pTVar2 = lj_tab_setstr(L_01,(GCtab *)t,(GCstr *)key);
  pTVar2->n = dVar3;
  return 1;
}

Assistant:

LJLIB_CF(misc_getmetrics)
{
  struct luam_Metrics metrics;
  GCtab *m;

  lua_createtable(L, 0, 19);
  m = tabV(L->top - 1);

  luaM_metrics(L, &metrics);

  setnumfield(L, m, "strhash_hit", metrics.strhash_hit);
  setnumfield(L, m, "strhash_miss", metrics.strhash_miss);

  setnumfield(L, m, "gc_strnum", metrics.gc_strnum);
  setnumfield(L, m, "gc_tabnum", metrics.gc_tabnum);
  setnumfield(L, m, "gc_udatanum", metrics.gc_udatanum);
  setnumfield(L, m, "gc_cdatanum", metrics.gc_cdatanum);

  setnumfield(L, m, "gc_total", metrics.gc_total);
  setnumfield(L, m, "gc_freed", metrics.gc_freed);
  setnumfield(L, m, "gc_allocated", metrics.gc_allocated);

  setnumfield(L, m, "gc_steps_pause", metrics.gc_steps_pause);
  setnumfield(L, m, "gc_steps_propagate", metrics.gc_steps_propagate);
  setnumfield(L, m, "gc_steps_atomic", metrics.gc_steps_atomic);
  setnumfield(L, m, "gc_steps_sweepstring", metrics.gc_steps_sweepstring);
  setnumfield(L, m, "gc_steps_sweep", metrics.gc_steps_sweep);
  setnumfield(L, m, "gc_steps_finalize", metrics.gc_steps_finalize);

  setnumfield(L, m, "jit_snap_restore", metrics.jit_snap_restore);
  setnumfield(L, m, "jit_trace_abort", metrics.jit_trace_abort);
  setnumfield(L, m, "jit_mcode_size", metrics.jit_mcode_size);
  setnumfield(L, m, "jit_trace_num", metrics.jit_trace_num);

  return 1;
}